

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

char * sqlite3VdbeExpandSql(Vdbe *p,char *zRawSql)

{
  uchar *puVar1;
  ushort uVar2;
  sqlite3 *psVar3;
  Mem *pMVar4;
  u8 uVar5;
  Vdbe *pVVar6;
  int nName;
  ulong uVar7;
  size_t sVar8;
  char *pcVar9;
  uint N;
  int nTotal;
  int iVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uchar *puVar14;
  long in_FS_OFFSET;
  int idx;
  StrAccum out;
  int tokenType;
  Mem utf8;
  char zBase [100];
  int local_13c;
  StrAccum local_138;
  int local_10c;
  long local_108;
  Vdbe *local_100;
  MemValue local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  sqlite3 *psStack_d0;
  undefined8 local_c8;
  sqlite3 *local_b8;
  long local_b0;
  char local_a8 [112];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_13c = 0;
  psVar3 = p->db;
  local_138.mxAlloc = psVar3->aLimit[0];
  local_138.zBase = local_a8;
  local_138.db = (sqlite3 *)0x0;
  local_138.nChar = 0;
  local_138.nAlloc = 100;
  local_138.accError = '\0';
  local_138.printfFlags = '\0';
  local_138.zText = local_138.zBase;
  if (psVar3->nVdbeExec < 2) {
    if (p->nVar == 0) {
      if (zRawSql == (char *)0x0) {
        N = 0;
      }
      else {
        sVar8 = strlen(zRawSql);
        N = (uint)sVar8 & 0x3fffffff;
      }
      sqlite3StrAccumAppend(&local_138,zRawSql,N);
    }
    else {
      local_100 = p;
      local_b8 = psVar3;
      if (*zRawSql != '\0') {
        iVar12 = 1;
        do {
          iVar10 = 0;
          puVar14 = (uchar *)zRawSql;
          do {
            nName = sqlite3GetToken(puVar14,&local_10c);
            if (local_10c == 0x87) goto LAB_0011b945;
            iVar10 = iVar10 + nName;
            puVar1 = puVar14 + nName;
            puVar14 = puVar14 + nName;
          } while (*puVar1 != '\0');
          nName = 0;
LAB_0011b945:
          sqlite3StrAccumAppend(&local_138,zRawSql,iVar10);
          pVVar6 = local_100;
          if (nName == 0) break;
          puVar14 = (uchar *)zRawSql + iVar10;
          if (*puVar14 == '?') {
            if (1 < nName) {
              sqlite3GetInt32((char *)(puVar14 + 1),&local_13c);
              iVar12 = local_13c;
            }
          }
          else {
            iVar12 = sqlite3VListNameToNum(local_100->pVList,(char *)puVar14,nName);
          }
          local_13c = iVar12;
          iVar12 = local_13c;
          lVar13 = (long)local_13c;
          pMVar4 = pVVar6->aVar;
          uVar2 = pMVar4[lVar13 + -1].flags;
          if ((uVar2 & 1) == 0) {
            if ((uVar2 & 4) == 0) {
              if ((uVar2 & 8) == 0) {
                if ((uVar2 & 2) == 0) {
                  if ((uVar2 >> 0xe & 1) == 0) {
                    uVar7 = local_138._24_8_ & 0xffffffff;
                    local_108 = lVar13;
                    if (local_138.nChar + 2 < local_138.nAlloc) {
                      local_138.nChar = local_138.nChar + 2;
                      (local_138.zText + uVar7)[0] = 'x';
                      (local_138.zText + uVar7)[1] = '\'';
                    }
                    else {
                      enlargeAndAppend(&local_138,"x\'",2);
                    }
                    if (0 < (long)pMVar4[lVar13 + -1].n) {
                      lVar11 = 0;
                      local_b0 = (long)pMVar4[lVar13 + -1].n;
                      do {
                        sqlite3XPrintf(&local_138,"%02x",(ulong)(byte)pMVar4[lVar13 + -1].z[lVar11])
                        ;
                        lVar11 = lVar11 + 1;
                      } while (local_b0 != lVar11);
                    }
                    uVar7 = local_138._24_8_ & 0xffffffff;
                    if (local_138.nChar + 1 < local_138.nAlloc) {
                      local_138.nChar = local_138.nChar + 1;
                      local_138.zText[uVar7] = '\'';
                    }
                    else {
                      enlargeAndAppend(&local_138,"\'",1);
                    }
                    iVar12 = (int)local_108;
                  }
                  else {
                    sqlite3XPrintf(&local_138,"zeroblob(%d)",
                                   (ulong)(uint)pMVar4[lVar13 + -1].u.nZero);
                  }
                }
                else if (local_b8->enc == '\x01') {
                  sqlite3XPrintf(&local_138,"\'%.*q\'",(ulong)(uint)pMVar4[lVar13 + -1].n,
                                 pMVar4[lVar13 + -1].z);
                }
                else {
                  local_d8 = 0;
                  local_e8 = 0;
                  uStack_e0 = 0;
                  local_f8.r = 0.0;
                  uStack_f0 = 0;
                  local_c8 = 0;
                  psStack_d0 = local_b8;
                  sqlite3VdbeMemSetStr
                            ((Mem *)&local_f8,pMVar4[lVar13 + -1].z,pMVar4[lVar13 + -1].n,
                             local_b8->enc,(_func_void_void_ptr *)0x0);
                  if ((((uStack_f0 & 2) != 0) && (uStack_f0._2_1_ != '\x01')) &&
                     (iVar10 = sqlite3VdbeMemTranslate((Mem *)&local_f8,'\x01'), iVar10 == 7)) {
                    local_138.accError = 1;
                    local_138._24_8_ = local_138._24_8_ & 0xffffffff;
                  }
                  sqlite3XPrintf(&local_138,"\'%.*q\'",uStack_f0 >> 0x20,local_e8);
                  if (((uStack_f0 & 0x2460) != 0) || ((int)local_d8 != 0)) {
                    vdbeMemClear((Mem *)&local_f8);
                  }
                }
              }
              else {
                sqlite3XPrintf(&local_138,"%!.15g",pMVar4[lVar13 + -1].u.nZero);
              }
            }
            else {
              sqlite3XPrintf(&local_138,"%lld",pMVar4[lVar13 + -1].u.r);
            }
          }
          else {
            uVar7 = local_138._24_8_ & 0xffffffff;
            if (local_138.nChar + 4 < local_138.nAlloc) {
              local_138.nChar = local_138.nChar + 4;
              builtin_strncpy(local_138.zText + uVar7,"NULL",4);
            }
            else {
              enlargeAndAppend(&local_138,"NULL",4);
            }
          }
          zRawSql = (char *)(puVar14 + nName);
          iVar12 = iVar12 + 1;
        } while (*zRawSql != '\0');
      }
    }
  }
  else if (*zRawSql != '\0') {
    do {
      lVar13 = 1;
      do {
        lVar11 = lVar13;
        if (zRawSql[lVar11 + -1] == '\n') break;
        lVar13 = lVar11 + 1;
      } while (zRawSql[lVar11] != '\0');
      uVar7 = local_138._24_8_ & 0xffffffff;
      if (local_138.nChar + 3 < local_138.nAlloc) {
        local_138.nChar = local_138.nChar + 3;
        local_138.zText[uVar7 + 2] = ' ';
        (local_138.zText + uVar7)[0] = '-';
        (local_138.zText + uVar7)[1] = '-';
      }
      else {
        enlargeAndAppend(&local_138,"-- ",3);
      }
      sqlite3StrAccumAppend(&local_138,zRawSql,(int)lVar11);
      pcVar9 = zRawSql + lVar11;
      zRawSql = zRawSql + lVar11;
    } while (*pcVar9 != '\0');
  }
  if (local_138.accError != '\0') {
    uVar5 = local_138.printfFlags;
    if ((local_138._36_2_ & 0x400) != 0) {
      if (local_138.zText != (char *)0x0) {
        sqlite3DbFreeNN(local_138.db,local_138.zText);
      }
      local_138._36_2_ = CONCAT11(uVar5,local_138.accError) & 0xfbff;
    }
    local_138.zText = (char *)0x0;
  }
  pcVar9 = sqlite3StrAccumFinish(&local_138);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pcVar9;
}

Assistant:

SQLITE_PRIVATE char *sqlite3VdbeExpandSql(
  Vdbe *p,                 /* The prepared statement being evaluated */
  const char *zRawSql      /* Raw text of the SQL statement */
){
  sqlite3 *db;             /* The database connection */
  int idx = 0;             /* Index of a host parameter */
  int nextIndex = 1;       /* Index of next ? host parameter */
  int n;                   /* Length of a token prefix */
  int nToken;              /* Length of the parameter token */
  int i;                   /* Loop counter */
  Mem *pVar;               /* Value of a host parameter */
  StrAccum out;            /* Accumulate the output here */
#ifndef SQLITE_OMIT_UTF16
  Mem utf8;                /* Used to convert UTF16 parameters into UTF8 for display */
#endif
  char zBase[100];         /* Initial working space */

  db = p->db;
  sqlite3StrAccumInit(&out, 0, zBase, sizeof(zBase), 
                      db->aLimit[SQLITE_LIMIT_LENGTH]);
  if( db->nVdbeExec>1 ){
    while( *zRawSql ){
      const char *zStart = zRawSql;
      while( *(zRawSql++)!='\n' && *zRawSql );
      sqlite3StrAccumAppend(&out, "-- ", 3);
      assert( (zRawSql - zStart) > 0 );
      sqlite3StrAccumAppend(&out, zStart, (int)(zRawSql-zStart));
    }
  }else if( p->nVar==0 ){
    sqlite3StrAccumAppend(&out, zRawSql, sqlite3Strlen30(zRawSql));
  }else{
    while( zRawSql[0] ){
      n = findNextHostParameter(zRawSql, &nToken);
      assert( n>0 );
      sqlite3StrAccumAppend(&out, zRawSql, n);
      zRawSql += n;
      assert( zRawSql[0] || nToken==0 );
      if( nToken==0 ) break;
      if( zRawSql[0]=='?' ){
        if( nToken>1 ){
          assert( sqlite3Isdigit(zRawSql[1]) );
          sqlite3GetInt32(&zRawSql[1], &idx);
        }else{
          idx = nextIndex;
        }
      }else{
        assert( zRawSql[0]==':' || zRawSql[0]=='$' ||
                zRawSql[0]=='@' || zRawSql[0]=='#' );
        testcase( zRawSql[0]==':' );
        testcase( zRawSql[0]=='$' );
        testcase( zRawSql[0]=='@' );
        testcase( zRawSql[0]=='#' );
        idx = sqlite3VdbeParameterIndex(p, zRawSql, nToken);
        assert( idx>0 );
      }
      zRawSql += nToken;
      nextIndex = idx + 1;
      assert( idx>0 && idx<=p->nVar );
      pVar = &p->aVar[idx-1];
      if( pVar->flags & MEM_Null ){
        sqlite3StrAccumAppend(&out, "NULL", 4);
      }else if( pVar->flags & MEM_Int ){
        sqlite3XPrintf(&out, "%lld", pVar->u.i);
      }else if( pVar->flags & MEM_Real ){
        sqlite3XPrintf(&out, "%!.15g", pVar->u.r);
      }else if( pVar->flags & MEM_Str ){
        int nOut;  /* Number of bytes of the string text to include in output */
#ifndef SQLITE_OMIT_UTF16
        u8 enc = ENC(db);
        if( enc!=SQLITE_UTF8 ){
          memset(&utf8, 0, sizeof(utf8));
          utf8.db = db;
          sqlite3VdbeMemSetStr(&utf8, pVar->z, pVar->n, enc, SQLITE_STATIC);
          if( SQLITE_NOMEM==sqlite3VdbeChangeEncoding(&utf8, SQLITE_UTF8) ){
            out.accError = STRACCUM_NOMEM;
            out.nAlloc = 0;
          }
          pVar = &utf8;
        }
#endif
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ){
          nOut = SQLITE_TRACE_SIZE_LIMIT;
          while( nOut<pVar->n && (pVar->z[nOut]&0xc0)==0x80 ){ nOut++; }
        }
#endif    
        sqlite3XPrintf(&out, "'%.*q'", nOut, pVar->z);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3XPrintf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
#ifndef SQLITE_OMIT_UTF16
        if( enc!=SQLITE_UTF8 ) sqlite3VdbeMemRelease(&utf8);
#endif
      }else if( pVar->flags & MEM_Zero ){
        sqlite3XPrintf(&out, "zeroblob(%d)", pVar->u.nZero);
      }else{
        int nOut;  /* Number of bytes of the blob to include in output */
        assert( pVar->flags & MEM_Blob );
        sqlite3StrAccumAppend(&out, "x'", 2);
        nOut = pVar->n;
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut>SQLITE_TRACE_SIZE_LIMIT ) nOut = SQLITE_TRACE_SIZE_LIMIT;
#endif
        for(i=0; i<nOut; i++){
          sqlite3XPrintf(&out, "%02x", pVar->z[i]&0xff);
        }
        sqlite3StrAccumAppend(&out, "'", 1);
#ifdef SQLITE_TRACE_SIZE_LIMIT
        if( nOut<pVar->n ){
          sqlite3XPrintf(&out, "/*+%d bytes*/", pVar->n-nOut);
        }
#endif
      }
    }
  }
  if( out.accError ) sqlite3StrAccumReset(&out);
  return sqlite3StrAccumFinish(&out);
}